

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_best_score(acmod_t *acmod,int *out_best_senid)

{
  byte bVar1;
  short sVar2;
  bin_mdef_t *pbVar3;
  uint8 *puVar4;
  int iVar5;
  int16 *piVar6;
  long lVar7;
  
  if (acmod->compallsen == '\0') {
    if (acmod->n_senone_active < 1) {
      return 0x7fff;
    }
    piVar6 = acmod->senone_scores;
    puVar4 = acmod->senone_active;
    iVar5 = 0x7fff;
    lVar7 = 0;
    do {
      bVar1 = puVar4[lVar7];
      sVar2 = piVar6[bVar1];
      if (sVar2 < iVar5) {
        *out_best_senid = (int)lVar7;
        iVar5 = (int)sVar2;
      }
      piVar6 = piVar6 + bVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < acmod->n_senone_active);
  }
  else {
    pbVar3 = acmod->mdef;
    if (pbVar3->n_sen < 1) {
      return 0x7fff;
    }
    piVar6 = acmod->senone_scores;
    iVar5 = 0x7fff;
    lVar7 = 0;
    do {
      sVar2 = piVar6[lVar7];
      if (sVar2 < iVar5) {
        *out_best_senid = (int)lVar7;
        iVar5 = (int)sVar2;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pbVar3->n_sen);
  }
  return iVar5;
}

Assistant:

int
acmod_best_score(acmod_t *acmod, int *out_best_senid)
{
    int i, best;

    best = SENSCR_DUMMY;
    if (acmod->compallsen) {
        for (i = 0; i < bin_mdef_n_sen(acmod->mdef); ++i) {
            if (acmod->senone_scores[i] < best) {
                best = acmod->senone_scores[i];
                *out_best_senid = i;
            }
        }
    }
    else {
        int16 *senscr;
        senscr = acmod->senone_scores;
        for (i = 0; i < acmod->n_senone_active; ++i) {
            senscr += acmod->senone_active[i];
            if (*senscr < best) {
                best = *senscr;
                *out_best_senid = i;
            }
        }
    }
    return best;
}